

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O3

int mqc_restart_enc(opj_mqc_t *mqc)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = mqc->ct;
  mqc->c = mqc->c << ((byte)uVar1 & 0x1f);
  iVar2 = 0xc;
  while (iVar2 = iVar2 - uVar1, 0 < iVar2) {
    mqc_byteout(mqc);
    uVar1 = mqc->ct;
    mqc->c = mqc->c << ((byte)uVar1 & 0x1f);
  }
  mqc_byteout(mqc);
  return 1;
}

Assistant:

int mqc_restart_enc(opj_mqc_t *mqc) {
	int correction = 1;
	
	/* <flush part> */
	int n = 27 - 15 - mqc->ct;
	mqc->c <<= mqc->ct;
	while (n > 0) {
		mqc_byteout(mqc);
		n -= mqc->ct;
		mqc->c <<= mqc->ct;
	}
	mqc_byteout(mqc);
	
	return correction;
}